

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::readCPPline(TPpContext *this,TPpToken *ppToken)

{
  array<const_char_*,_2UL> extensions;
  bool bVar1;
  int iVar2;
  array<const_char_*,_2UL> exts;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  exts._M_elems[1]._4_4_ = scanToken(this,ppToken);
  if (exts._M_elems[1]._4_4_ == 0xa2) {
    iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    switch(iVar2) {
    case 0xa3:
      exts._M_elems[1]._4_4_ = CPPdefine(this,ppToken);
      break;
    case 0xa4:
      exts._M_elems[1]._4_4_ = CPPundef(this,ppToken);
      break;
    case 0xa5:
      exts._M_elems[1]._4_4_ = CPPif(this,ppToken);
      break;
    case 0xa6:
      exts._M_elems[1]._4_4_ = CPPifdef(this,1,ppToken);
      break;
    case 0xa7:
      exts._M_elems[1]._4_4_ = CPPifdef(this,0,ppToken);
      break;
    case 0xa8:
      if ((this->elseSeen[this->elsetracker] & 1U) != 0) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"#else after #else","#else","");
      }
      this->elseSeen[this->elsetracker] = true;
      if (this->ifdepth == 0) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"mismatched statements","#else","");
      }
      iVar2 = scanToken(this,ppToken);
      extraTokenCheck(this,0xa8,ppToken,iVar2);
      exts._M_elems[1]._4_4_ = CPPelse(this,0,ppToken);
      break;
    case 0xa9:
      if (this->ifdepth == 0) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"mismatched statements","#elif","");
      }
      if ((this->elseSeen[this->elsetracker] & 1U) != 0) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"#elif after #else","#elif","");
      }
      exts._M_elems[1]._4_4_ = scanToken(this,ppToken);
      while (exts._M_elems[1]._4_4_ != 10 && exts._M_elems[1]._4_4_ != -1) {
        exts._M_elems[1]._4_4_ = scanToken(this,ppToken);
      }
      exts._M_elems[1]._4_4_ = CPPelse(this,0,ppToken);
      break;
    case 0xaa:
      if (this->ifdepth == 0) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"mismatched statements","#endif","");
      }
      else {
        this->elseSeen[this->elsetracker] = false;
        this->elsetracker = this->elsetracker + -1;
        this->ifdepth = this->ifdepth + -1;
      }
      iVar2 = scanToken(this,ppToken);
      exts._M_elems[1]._4_4_ = extraTokenCheck(this,0xaa,ppToken,iVar2);
      break;
    case 0xab:
      exts._M_elems[1]._4_4_ = CPPline(this,ppToken);
      break;
    case 0xac:
      exts._M_elems[1]._4_4_ = CPPpragma(this,ppToken);
      break;
    case 0xad:
      exts._M_elems[1]._4_4_ = CPPerror(this,ppToken);
      break;
    case 0xae:
      exts._M_elems[1]._4_4_ = CPPversion(this,ppToken);
      break;
    default:
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"invalid directive:","#",ppToken->name);
      break;
    case 0xb2:
      exts._M_elems[1]._4_4_ = CPPextension(this,ppToken);
      break;
    case 0xb6:
      bVar1 = TParseVersions::isReadingHLSL(&this->parseContext->super_TParseVersions);
      if (!bVar1) {
        extensions._M_elems[1] = "GL_ARB_shading_language_include";
        extensions._M_elems[0] = "GL_GOOGLE_include_directive";
        TParseVersions::ppRequireExtensions<std::array<char_const*,2ul>>
                  (&this->parseContext->super_TParseVersions,&ppToken->loc,extensions,"#include");
      }
      exts._M_elems[1]._4_4_ = CPPinclude(this,ppToken);
    }
  }
  else if ((exts._M_elems[1]._4_4_ != 10) && (exts._M_elems[1]._4_4_ != -1)) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"invalid directive","#","");
  }
  while (exts._M_elems[1]._4_4_ != 10 && exts._M_elems[1]._4_4_ != -1) {
    exts._M_elems[1]._4_4_ = scanToken(this,ppToken);
  }
  return exts._M_elems[1]._4_4_;
}

Assistant:

int TPpContext::readCPPline(TPpToken* ppToken)
{
    int token = scanToken(ppToken);

    if (token == PpAtomIdentifier) {
        switch (atomStrings.getAtom(ppToken->name)) {
        case PpAtomDefine:
            token = CPPdefine(ppToken);
            break;
        case PpAtomElse:
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#else after #else", "#else", "");
            elseSeen[elsetracker] = true;
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#else", "");
            token = extraTokenCheck(PpAtomElse, ppToken, scanToken(ppToken));
            token = CPPelse(0, ppToken);
            break;
        case PpAtomElif:
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#elif", "");
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
            // this token is really a dont care, but we still need to eat the tokens
            token = scanToken(ppToken);
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);
            token = CPPelse(0, ppToken);
            break;
        case PpAtomEndif:
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#endif", "");
            else {
                elseSeen[elsetracker] = false;
                --elsetracker;
                --ifdepth;
            }
            token = extraTokenCheck(PpAtomEndif, ppToken, scanToken(ppToken));
            break;
        case PpAtomIf:
            token = CPPif(ppToken);
            break;
        case PpAtomIfdef:
            token = CPPifdef(1, ppToken);
            break;
        case PpAtomIfndef:
            token = CPPifdef(0, ppToken);
            break;
        case PpAtomLine:
            token = CPPline(ppToken);
            break;
        case PpAtomInclude:
            if(!parseContext.isReadingHLSL()) {
                const std::array exts = { E_GL_GOOGLE_include_directive, E_GL_ARB_shading_language_include };
                parseContext.ppRequireExtensions(ppToken->loc, exts, "#include");
            }
            token = CPPinclude(ppToken);
            break;
        case PpAtomPragma:
            token = CPPpragma(ppToken);
            break;
        case PpAtomUndef:
            token = CPPundef(ppToken);
            break;
        case PpAtomError:
            token = CPPerror(ppToken);
            break;
        case PpAtomVersion:
            token = CPPversion(ppToken);
            break;
        case PpAtomExtension:
            token = CPPextension(ppToken);
            break;
        default:
            parseContext.ppError(ppToken->loc, "invalid directive:", "#", ppToken->name);
            break;
        }
    } else if (token != '\n' && token != EndOfInput)
        parseContext.ppError(ppToken->loc, "invalid directive", "#", "");

    while (token != '\n' && token != EndOfInput)
        token = scanToken(ppToken);

    return token;
}